

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::remove_vertex(Graph *this,vertex_t v)

{
  uint *puVar1;
  pointer *ppuVar2;
  pointer pvVar3;
  uint *puVar4;
  uint *puVar5;
  pointer puVar6;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var7
  ;
  ulong uVar8;
  ulong uVar9;
  uint *i;
  uint *puVar10;
  vertex_t local_34;
  
  uVar9 = (ulong)v;
  pvVar3 = (this->pred_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->pred_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
          -0x5555555555555555;
  local_34 = v;
  if (uVar9 <= uVar8 && uVar8 - uVar9 != 0) {
    puVar10 = pvVar3[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar4 = *(pointer *)
              ((long)&pvVar3[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 8);
    if (puVar10 != puVar4) {
      do {
        uVar9 = (ulong)*puVar10;
        pvVar3 = (this->succ_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = ((long)(this->succ_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                -0x5555555555555555;
        if (uVar8 < uVar9 || uVar8 - uVar9 == 0) goto LAB_001039f3;
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                          (*(undefined8 *)
                            &pvVar3[uVar9].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                           ,*(pointer *)
                             ((long)&pvVar3[uVar9].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl + 8),&local_34);
        puVar1 = _Var7._M_current + 1;
        puVar5 = *(pointer *)
                  ((long)&pvVar3[uVar9].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                  8);
        if (puVar1 != puVar5) {
          memmove(_Var7._M_current,puVar1,(long)puVar5 - (long)puVar1);
        }
        ppuVar2 = (pointer *)
                  ((long)&pvVar3[uVar9].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                  8);
        *ppuVar2 = *ppuVar2 + -1;
        puVar6 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->deg_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar6 >> 2) <= (ulong)*puVar10)
        goto LAB_001039f3;
        puVar6 = puVar6 + *puVar10;
        *puVar6 = *puVar6 - 1;
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar4);
    }
    uVar9 = (ulong)local_34;
    pvVar3 = (this->succ_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->succ_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
            -0x5555555555555555;
    if (uVar9 <= uVar8 && uVar8 - uVar9 != 0) {
      puVar10 = *(uint **)&pvVar3[uVar9].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      puVar4 = *(pointer *)
                ((long)&pvVar3[uVar9].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)
      ;
      if (puVar10 != puVar4) {
        do {
          uVar9 = (ulong)*puVar10;
          pvVar3 = (this->pred_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = ((long)(this->pred_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                  -0x5555555555555555;
          if (uVar8 < uVar9 || uVar8 - uVar9 == 0) goto LAB_001039f3;
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                            (pvVar3[uVar9].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,
                             *(pointer *)
                              ((long)&pvVar3[uVar9].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data + 8),&local_34);
          puVar1 = _Var7._M_current + 1;
          puVar5 = *(pointer *)
                    ((long)&pvVar3[uVar9].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8);
          if (puVar1 != puVar5) {
            memmove(_Var7._M_current,puVar1,(long)puVar5 - (long)puVar1);
          }
          ppuVar2 = (pointer *)
                    ((long)&pvVar3[uVar9].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8);
          *ppuVar2 = *ppuVar2 + -1;
          puVar6 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->deg_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar6 >> 2) <=
              (ulong)*puVar10) goto LAB_001039f3;
          puVar6 = puVar6 + *puVar10;
          *puVar6 = *puVar6 - 1;
          puVar10 = puVar10 + 1;
        } while (puVar10 != puVar4);
      }
      puVar6 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)local_34 <
          (ulong)((long)(this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2)) {
        puVar6[local_34] = 0;
        uVar9 = (ulong)local_34;
        pvVar3 = (this->succ_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = ((long)(this->succ_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                -0x5555555555555555;
        if (uVar9 <= uVar8 && uVar8 - uVar9 != 0) {
          puVar6 = *(pointer *)
                    &pvVar3[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl;
          if (*(pointer *)
               ((long)&pvVar3[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl + 8) != puVar6) {
            *(pointer *)
             ((long)&pvVar3[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl + 8) = puVar6;
          }
          pvVar3 = (this->pred_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = ((long)(this->pred_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                  -0x5555555555555555;
          if (uVar9 <= uVar8 && uVar8 - uVar9 != 0) {
            puVar6 = pvVar3[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (*(pointer *)
                 ((long)&pvVar3[uVar9].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8) != puVar6) {
              *(pointer *)
               ((long)&pvVar3[uVar9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data + 8) = puVar6;
            }
            return;
          }
        }
      }
    }
  }
LAB_001039f3:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void Graph::remove_vertex(vertex_t v) {
    for (const auto &i : pred_.at(v)) {
        succ_.at(i).erase(find(succ_.at(i).begin(), succ_.at(i).end(), v));
        --deg_.at(i);
    }
    for (const auto &i : succ_.at(v)) {
        pred_.at(i).erase(find(pred_.at(i).begin(), pred_.at(i).end(), v));
        --deg_.at(i);
    }
    deg_.at(v) = 0;

    succ_.at(v).clear();
    pred_.at(v).clear();
}